

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void Configtable_clear(_func_int_config_ptr *f)

{
  int iVar1;
  s_x4 *psVar2;
  long lVar3;
  long lVar4;
  
  if ((x4a != (s_x4 *)0x0) && (x4a->count != 0)) {
    if ((f != (_func_int_config_ptr *)0x0) && (0 < x4a->count)) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        (*f)(*(config **)((long)&x4a->tbl->data + lVar3));
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x18;
      } while (lVar4 < x4a->count);
    }
    psVar2 = x4a;
    iVar1 = x4a->size;
    if (0 < (long)iVar1) {
      lVar3 = 0;
      do {
        psVar2->ht[lVar3] = (s_x4node *)0x0;
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
    psVar2->count = 0;
  }
  return;
}

Assistant:

void Configtable_clear(int(*f)(struct config *))
{
  int i;
  if( x4a==0 || x4a->count==0 ) return;
  if( f ) for(i=0; i<x4a->count; i++) (*f)(x4a->tbl[i].data);
  for(i=0; i<x4a->size; i++) x4a->ht[i] = 0;
  x4a->count = 0;
  return;
}